

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void tx_block_yrd(AV1_COMP *cpi,MACROBLOCK *x,int blk_row,int blk_col,int block,TX_SIZE tx_size,
                 BLOCK_SIZE plane_bsize,int depth,ENTROPY_CONTEXT *above_ctx,
                 ENTROPY_CONTEXT *left_ctx,TXFM_CONTEXT *tx_above,TXFM_CONTEXT *tx_left,
                 int64_t ref_best_rd,RD_STATS *rd_stats,FAST_TX_SEARCH_MODE ftxs_mode)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int in_ECX;
  ulong uVar5;
  int in_EDX;
  AV1_COMP *in_RSI;
  int in_R8D;
  undefined1 in_R9B;
  uint uVar6;
  BLOCK_SIZE unaff_retaddr;
  BLOCK_SIZE BStack0000000000000008;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  ENTROPY_CONTEXT *in_stack_00000018;
  TXFM_CONTEXT *in_stack_00000020;
  TXFM_CONTEXT *in_stack_00000028;
  long in_stack_00000030;
  RD_STATS *in_stack_00000038;
  FAST_TX_SEARCH_MODE in_stack_00000040;
  undefined7 in_stack_00000041;
  int offsetc;
  int col;
  int offsetr;
  int row;
  int64_t this_rd;
  RD_STATS pn_rd_stats;
  int col_end;
  int row_end;
  int step;
  int txb_height;
  int txb_width;
  TX_SIZE sub_txs;
  TxfmSearchInfo *txfm_info;
  int mi_width;
  int zero_blk_rate;
  TXB_CTX txb_ctx;
  TX_SIZE txs_ctx;
  ENTROPY_CONTEXT *tl;
  ENTROPY_CONTEXT *ta;
  int ctx;
  TX_SIZE plane_tx_size;
  int max_blocks_wide;
  int max_blocks_high;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  RD_STATS *in_stack_fffffffffffffeb0;
  int *l;
  undefined4 uVar7;
  ENTROPY_CONTEXT *in_stack_fffffffffffffeb8;
  ENTROPY_CONTEXT *a;
  TXFM_CONTEXT *in_stack_fffffffffffffec0;
  TX_SIZE tx_size_00;
  TXFM_CONTEXT *in_stack_fffffffffffffec8;
  MACROBLOCK *in_stack_fffffffffffffed0;
  int local_108;
  int local_104;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int iVar8;
  int in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  TX_SIZE tx_size_01;
  int iVar9;
  MACROBLOCK *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar10;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  FAST_TX_SEARCH_MODE in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_84 [2];
  byte local_79;
  TXFM_CONTEXT *local_78;
  ENTROPY_CONTEXT *local_70;
  int local_68;
  byte local_61;
  int local_60;
  int local_5c;
  long local_58;
  MACROBLOCKD *xd_00;
  undefined3 in_stack_ffffffffffffffb8;
  int iVar11;
  TX_SIZE tx_size_02;
  AV1_COMP *pAVar12;
  
  tx_size_01 = (TX_SIZE)((uint)in_stack_ffffffffffffff1c >> 0x18);
  iVar11 = CONCAT13(in_R9B,in_stack_ffffffffffffffb8);
  xd_00 = (MACROBLOCKD *)((in_RSI->enc_quant_dequant_params).quants.y_quant + 0x19);
  local_58 = **(long **)((in_RSI->enc_quant_dequant_params).quants.y_zbin[4] + 4);
  local_5c = max_block_high(xd_00,BStack0000000000000008,0);
  local_60 = max_block_wide(xd_00,BStack0000000000000008,0);
  lVar1 = local_58;
  if ((in_EDX < local_5c) && (in_ECX < local_60)) {
    iVar3 = av1_get_txb_size_index(BStack0000000000000008,in_EDX,in_ECX);
    local_61 = *(byte *)(lVar1 + 0x92 + (long)iVar3);
    local_68 = txfm_partition_context
                         (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                          (BLOCK_SIZE)((ulong)in_stack_fffffffffffffeb8 >> 0x38),
                          (TX_SIZE)((ulong)in_stack_fffffffffffffeb8 >> 0x30));
    av1_init_rd_stats((RD_STATS *)CONCAT71(in_stack_00000041,in_stack_00000040));
    bVar2 = (byte)((uint)iVar11 >> 0x18);
    if (bVar2 == local_61) {
      local_70 = in_stack_00000018 + in_ECX;
      local_78 = in_stack_00000020 + in_EDX;
      local_79 = get_txsize_entropy_ctx(bVar2);
      tx_size_02 = (TX_SIZE)((uint)iVar11 >> 0x18);
      get_txb_ctx((BLOCK_SIZE)((ulong)in_stack_fffffffffffffec0 >> 0x38),
                  (TX_SIZE)((ulong)in_stack_fffffffffffffec0 >> 0x30),(int)in_stack_fffffffffffffec0
                  ,in_stack_fffffffffffffeb8,(ENTROPY_CONTEXT *)in_stack_fffffffffffffeb0,
                  (TXB_CTX *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      tx_size_00 = (TX_SIZE)((ulong)in_stack_fffffffffffffec0 >> 0x38);
      uVar5 = (ulong)local_79;
      pAVar12 = in_RSI;
      bVar2 = get_plane_type(0);
      iVar11 = *(int *)((in_RSI->enc_quant_dequant_params).quants.v_quant
                        [uVar5 * 0x1d8 + (ulong)bVar2 * 0xec + 0x9c] + (long)local_84[0] * 4 + 6);
      *(int *)(CONCAT71(in_stack_00000041,in_stack_00000040) + 4) = iVar11;
      a = (ENTROPY_CONTEXT *)CONCAT71(in_stack_00000041,in_stack_00000040);
      l = local_84;
      tx_type_rd((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 in_stack_ffffffffffffff20,tx_size_01,in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,in_stack_ffffffffffffff50,
                 (TXB_CTX *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (RD_STATS *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff68,
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [BStack0000000000000008];
      if ((((long)*(int *)CONCAT71(in_stack_00000041,in_stack_00000040) *
            (long)*(int *)((pAVar12->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) + 0x100
           >> 9) + *(long *)(CONCAT71(in_stack_00000041,in_stack_00000040) + 8) * 0x80 <
           ((long)iVar11 *
            (long)*(int *)((pAVar12->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) + 0x100
           >> 9) + *(long *)(CONCAT71(in_stack_00000041,in_stack_00000040) + 0x18) * 0x80) &&
         (*(char *)(CONCAT71(in_stack_00000041,in_stack_00000040) + 0x20) != '\x01')) {
        *(undefined1 *)(CONCAT71(in_stack_00000041,in_stack_00000040) + 0x20) = 0;
        set_blk_skip((uint8_t *)
                     ((long)((pAVar12->td).mb.coeff_costs.coeff_costs[2][0].lps_cost + 6) + 0x59),0,
                     in_EDX * (uint)bVar2 + in_ECX,0);
      }
      else {
        *(int *)CONCAT71(in_stack_00000041,in_stack_00000040) = iVar11;
        *(undefined8 *)(CONCAT71(in_stack_00000041,in_stack_00000040) + 8) =
             *(undefined8 *)(CONCAT71(in_stack_00000041,in_stack_00000040) + 0x18);
        *(undefined1 *)(CONCAT71(in_stack_00000041,in_stack_00000040) + 0x20) = 1;
        set_blk_skip((uint8_t *)
                     ((long)((pAVar12->td).mb.coeff_costs.coeff_costs[2][0].lps_cost + 6) + 0x59),0,
                     in_EDX * (uint)bVar2 + in_ECX,1);
        *(undefined2 *)
         (*(long *)(pAVar12->enc_quant_dequant_params).quants.y_quant[1] + (long)in_R8D * 2) = 0;
        *(undefined1 *)
         (*(long *)((pAVar12->enc_quant_dequant_params).quants.y_quant[1] + 4) + (long)in_R8D) = 0;
        update_txk_array(xd_00,in_EDX,in_ECX,tx_size_02,'\0');
      }
      if ((tx_size_02 != '\0') && (in_stack_00000010 < 2)) {
        *(int *)CONCAT71(in_stack_00000041,in_stack_00000040) =
             *(int *)((pAVar12->enc_quant_dequant_params).quants.u_round_fp[0xd7] +
                     (long)local_68 * 4 + 4) + *(int *)CONCAT71(in_stack_00000041,in_stack_00000040)
        ;
      }
      av1_set_txb_context(in_stack_fffffffffffffed0,(int)((ulong)in_stack_00000038 >> 0x20),
                          (int)in_stack_00000038,tx_size_00,a,(ENTROPY_CONTEXT *)l);
      txfm_partition_update
                (in_stack_00000028 + in_ECX,(TXFM_CONTEXT *)(in_stack_00000030 + in_EDX),tx_size_02,
                 tx_size_02);
    }
    else {
      iVar3 = tx_size_wide_unit[""[bVar2]];
      iVar10 = tx_size_high_unit[""[bVar2]];
      iVar4 = iVar10 * iVar3;
      if (tx_size_high_unit[bVar2] < local_5c - in_EDX) {
        local_104 = tx_size_high_unit[bVar2];
      }
      else {
        local_104 = local_5c - in_EDX;
      }
      if (tx_size_wide_unit[bVar2] < local_60 - in_ECX) {
        local_108 = tx_size_wide_unit[bVar2];
      }
      else {
        local_108 = local_60 - in_ECX;
      }
      for (iVar9 = 0; iVar9 < local_104; iVar9 = iVar10 + iVar9) {
        for (iVar8 = 0; uVar7 = (undefined4)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
            iVar8 < local_108; iVar8 = iVar3 + iVar8) {
          av1_init_rd_stats((RD_STATS *)&stack0xffffffffffffff28);
          uVar6 = _BStack0000000000000008 & 0xff;
          in_stack_fffffffffffffeb0 = (RD_STATS *)CONCAT44(uVar7,in_stack_00000010 + 1);
          tx_block_yrd(in_RSI,(MACROBLOCK *)CONCAT44(in_EDX,in_ECX),in_R8D,iVar11,
                       (int)((ulong)xd_00 >> 0x20),(TX_SIZE)((ulong)xd_00 >> 0x18),unaff_retaddr,
                       _BStack0000000000000008,
                       (ENTROPY_CONTEXT *)CONCAT44(in_stack_00000014,in_stack_00000010),
                       in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030,
                       in_stack_00000038,in_stack_00000040);
          if (in_stack_ffffffffffffff28 == 0x7fffffff) {
            av1_invalid_rd_stats((RD_STATS *)CONCAT71(in_stack_00000041,in_stack_00000040));
            return;
          }
          av1_merge_rd_stats(in_stack_fffffffffffffeb0,
                             (RD_STATS *)CONCAT44(in_stack_fffffffffffffeac,uVar6));
          in_R8D = iVar4 + in_R8D;
        }
      }
      if (((char)((uint)iVar11 >> 0x18) != '\0') && (in_stack_00000010 < 2)) {
        *(int *)CONCAT71(in_stack_00000041,in_stack_00000040) =
             *(int *)((in_RSI->enc_quant_dequant_params).quants.u_round_fp[0xd7] +
                     (long)local_68 * 4 + 6) + *(int *)CONCAT71(in_stack_00000041,in_stack_00000040)
        ;
      }
    }
  }
  return;
}

Assistant:

static inline void tx_block_yrd(const AV1_COMP *cpi, MACROBLOCK *x, int blk_row,
                                int blk_col, int block, TX_SIZE tx_size,
                                BLOCK_SIZE plane_bsize, int depth,
                                ENTROPY_CONTEXT *above_ctx,
                                ENTROPY_CONTEXT *left_ctx,
                                TXFM_CONTEXT *tx_above, TXFM_CONTEXT *tx_left,
                                int64_t ref_best_rd, RD_STATS *rd_stats,
                                FAST_TX_SEARCH_MODE ftxs_mode) {
  assert(tx_size < TX_SIZES_ALL);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(is_inter_block(mbmi));
  const int max_blocks_high = max_block_high(xd, plane_bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, 0);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  const TX_SIZE plane_tx_size = mbmi->inter_tx_size[av1_get_txb_size_index(
      plane_bsize, blk_row, blk_col)];
  const int ctx = txfm_partition_context(tx_above + blk_col, tx_left + blk_row,
                                         mbmi->bsize, tx_size);

  av1_init_rd_stats(rd_stats);
  if (tx_size == plane_tx_size) {
    ENTROPY_CONTEXT *ta = above_ctx + blk_col;
    ENTROPY_CONTEXT *tl = left_ctx + blk_row;
    const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
    TXB_CTX txb_ctx;
    get_txb_ctx(plane_bsize, tx_size, 0, ta, tl, &txb_ctx);

    const int zero_blk_rate =
        x->coeff_costs.coeff_costs[txs_ctx][get_plane_type(0)]
            .txb_skip_cost[txb_ctx.txb_skip_ctx][1];
    rd_stats->zero_rate = zero_blk_rate;
    tx_type_rd(cpi, x, tx_size, blk_row, blk_col, block, plane_bsize, &txb_ctx,
               rd_stats, ftxs_mode, ref_best_rd);
    const int mi_width = mi_size_wide[plane_bsize];
    TxfmSearchInfo *txfm_info = &x->txfm_search_info;
    if (RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist) >=
            RDCOST(x->rdmult, zero_blk_rate, rd_stats->sse) ||
        rd_stats->skip_txfm == 1) {
      rd_stats->rate = zero_blk_rate;
      rd_stats->dist = rd_stats->sse;
      rd_stats->skip_txfm = 1;
      set_blk_skip(txfm_info->blk_skip, 0, blk_row * mi_width + blk_col, 1);
      x->plane[0].eobs[block] = 0;
      x->plane[0].txb_entropy_ctx[block] = 0;
      update_txk_array(xd, blk_row, blk_col, tx_size, DCT_DCT);
    } else {
      rd_stats->skip_txfm = 0;
      set_blk_skip(txfm_info->blk_skip, 0, blk_row * mi_width + blk_col, 0);
    }
    if (tx_size > TX_4X4 && depth < MAX_VARTX_DEPTH)
      rd_stats->rate += x->mode_costs.txfm_partition_cost[ctx][0];
    av1_set_txb_context(x, 0, block, tx_size, ta, tl);
    txfm_partition_update(tx_above + blk_col, tx_left + blk_row, tx_size,
                          tx_size);
  } else {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int txb_width = tx_size_wide_unit[sub_txs];
    const int txb_height = tx_size_high_unit[sub_txs];
    const int step = txb_height * txb_width;
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);
    RD_STATS pn_rd_stats;
    int64_t this_rd = 0;
    assert(txb_width > 0 && txb_height > 0);

    for (int row = 0; row < row_end; row += txb_height) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < col_end; col += txb_width) {
        const int offsetc = blk_col + col;

        av1_init_rd_stats(&pn_rd_stats);
        tx_block_yrd(cpi, x, offsetr, offsetc, block, sub_txs, plane_bsize,
                     depth + 1, above_ctx, left_ctx, tx_above, tx_left,
                     ref_best_rd - this_rd, &pn_rd_stats, ftxs_mode);
        if (pn_rd_stats.rate == INT_MAX) {
          av1_invalid_rd_stats(rd_stats);
          return;
        }
        av1_merge_rd_stats(rd_stats, &pn_rd_stats);
        this_rd += RDCOST(x->rdmult, pn_rd_stats.rate, pn_rd_stats.dist);
        block += step;
      }
    }

    if (tx_size > TX_4X4 && depth < MAX_VARTX_DEPTH)
      rd_stats->rate += x->mode_costs.txfm_partition_cost[ctx][1];
  }
}